

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall blc::network::Server::resume(Server *this)

{
  mutex *in_RDI;
  
  std::mutex::lock(in_RDI);
  (in_RDI->super___mutex_base)._M_mutex.__size[0x20] = '\0';
  std::mutex::unlock((mutex *)0x1204be);
  return;
}

Assistant:

void blc::network::Server::resume() {
	this->_mutex.lock();
	this->_stop = false;
	this->_mutex.unlock();
}